

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forDynamicArray
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Type *elementType,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  bool bVar1;
  Expression *pEVar2;
  ReplicatedAssignmentPatternExpression *expr;
  bool bad;
  size_t count;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elems;
  uint7 in_stack_ffffffffffffffb0;
  char cVar3;
  Type *local_48;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_40;
  
  local_48 = (Type *)0x0;
  pEVar2 = bindReplCount(comp,(syntax->countExpr).ptr,context,(size_t *)&local_48);
  bVar1 = Expression::bad(pEVar2);
  if (bVar1) {
    pEVar2 = Expression::badExpr(comp,(Expression *)0x0);
    return pEVar2;
  }
  cVar3 = '\0';
  sourceRange_00.endLoc = (SourceLocation)&stack0xffffffffffffffb7;
  sourceRange_00.startLoc = sourceRange.endLoc;
  local_40 = bindExpressionList((ast *)type,elementType,local_48,0,(int)syntax + 0x40,
                                (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)context,
                                (ASTContext *)sourceRange.startLoc,sourceRange_00,
                                (bool *)(ulong)in_stack_ffffffffffffffb0);
  expr = BumpAllocator::
         emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
                   (&comp->super_BumpAllocator,type,pEVar2,&local_40,&sourceRange);
  if (cVar3 == '\x01') {
    expr = (ReplicatedAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)expr);
  }
  return (Expression *)expr;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forDynamicArray(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Type& elementType, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    bool bad = false;
    auto elems = bindExpressionList(type, elementType, count, 0, syntax.items, context, sourceRange,
                                    bad);

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr, elems,
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}